

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression.hpp
# Opt level: O2

value_type __thiscall
boost::numeric::ublas::
vector_scalar_binary<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::vector_inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>,_boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_double>_>
::evaluate(void *this)

{
  result_type rVar1;
  
  rVar1 = vector_inner_prod<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>,double>
          ::
          apply<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>const>,boost::numeric::ublas::scalar_multiplies<double,double>>,boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>>
                    ((vector_expression<boost::numeric::ublas::vector_binary<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>,_boost::numeric::ublas::scalar_multiplies<double,_double>_>_>
                      *)this,(vector_expression<boost::numeric::ublas::matrix_row<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                              *)((long)this + 0x20));
  return rVar1;
}

Assistant:

BOOST_UBLAS_INLINE
        value_type evaluate (dense_random_access_iterator_tag) const {
            BOOST_UBLAS_CHECK (e1_.size () == e2_.size (), external_logic());
#ifdef BOOST_UBLAS_USE_INDEXING
            return functor_type::apply (e1_, e2_);
#elif BOOST_UBLAS_USE_ITERATING
            difference_type size = BOOST_UBLAS_SAME (e1_.size (), e2_.size ());
            return functor_type::apply (size, e1_.begin (), e2_.begin ());
#else
            difference_type size = BOOST_UBLAS_SAME (e1_.size (), e2_.size ());
            if (size >= BOOST_UBLAS_ITERATOR_THRESHOLD)
                return functor_type::apply (size, e1_.begin (), e2_.begin ());
            else
                return functor_type::apply (e1_, e2_);
#endif
        }